

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool __thiscall NJamSpell::TTokenizer::LoadAlphabet(TTokenizer *this,string *alphabetFile)

{
  bool bVar1;
  ulong uVar2;
  reference pwVar3;
  wchar_t local_cc;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_c8;
  wchar_t chr;
  iterator __end1;
  iterator __begin1;
  wstring *__range1;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  alphabet;
  NJamSpell local_68 [8];
  wstring wdata;
  NJamSpell local_40 [8];
  string data;
  string *alphabetFile_local;
  TTokenizer *this_local;
  
  LoadFile(local_40,alphabetFile);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    UTF8ToWide(local_68,(string *)local_40);
    uVar2 = std::__cxx11::wstring::empty();
    if ((uVar2 & 1) == 0) {
      ToLower((wstring *)local_68);
      std::
      unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>::
      unordered_set((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                     *)&__range1);
      __end1._M_current = (wchar_t *)std::__cxx11::wstring::begin();
      _Stack_c8._M_current = (wchar_t *)std::__cxx11::wstring::end();
      while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff38), bVar1) {
        pwVar3 = __gnu_cxx::
                 __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 ::operator*(&__end1);
        local_cc = *pwVar3;
        if ((local_cc != L'\n') && (local_cc != L'\r')) {
          std::
          unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
          ::insert((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                    *)&__range1,&local_cc);
        }
        __gnu_cxx::
        __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::operator++(&__end1);
      }
      bVar1 = std::
              unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
              ::empty((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                       *)&__range1);
      if (!bVar1) {
        std::
        unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
        ::operator=(&this->Alphabet,
                    (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                     *)&__range1);
      }
      this_local._7_1_ = !bVar1;
      std::
      unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>::
      ~unordered_set((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                      *)&__range1);
    }
    else {
      this_local._7_1_ = false;
    }
    std::__cxx11::wstring::~wstring((wstring *)local_68);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool TTokenizer::LoadAlphabet(const std::string& alphabetFile) {
    std::string data = LoadFile(alphabetFile);
    if (data.empty()) {
        return false;
    }
    std::wstring wdata = UTF8ToWide(data);
    if (wdata.empty()) {
        return false;
    }
    ToLower(wdata);
    std::unordered_set<wchar_t> alphabet;
    for (auto chr: wdata) {
        if (chr == 10 || chr == 13) {
            continue;
        }
        alphabet.insert(chr);
    }
    if (alphabet.empty()) {
        return false;
    }
    Alphabet = alphabet;
    return true;
}